

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_floor.cpp
# Opt level: O1

void __thiscall DElevator::Destroy(DElevator *this)

{
  DInterpolation *pDVar1;
  
  pDVar1 = (this->m_Interp_Ceiling).field_0.p;
  if (pDVar1 != (DInterpolation *)0x0) {
    if (((pDVar1->super_DObject).ObjectFlags & 0x20) == 0) {
      DInterpolation::DelRef((this->m_Interp_Ceiling).field_0.p,false);
    }
    (this->m_Interp_Ceiling).field_0.p = (DInterpolation *)0x0;
  }
  pDVar1 = (this->m_Interp_Floor).field_0.p;
  if (pDVar1 != (DInterpolation *)0x0) {
    if (((pDVar1->super_DObject).ObjectFlags & 0x20) == 0) {
      DInterpolation::DelRef((this->m_Interp_Floor).field_0.p,false);
    }
    (this->m_Interp_Floor).field_0.p = (DInterpolation *)0x0;
  }
  DMover::Destroy(&this->super_DMover);
  return;
}

Assistant:

void DElevator::Destroy()
{
	if (m_Interp_Ceiling != NULL)
	{
		m_Interp_Ceiling->DelRef();
		m_Interp_Ceiling = NULL;
	}
	if (m_Interp_Floor != NULL)
	{
		m_Interp_Floor->DelRef();
		m_Interp_Floor = NULL;
	}
	Super::Destroy();
}